

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int __thiscall
glslang::TIntermediate::addUsedOffsets(TIntermediate *this,int binding,int offset,int numOffsets)

{
  int iVar1;
  pointer pTVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  TOffsetRange range;
  
  range.binding = (TRange)((ulong)(uint)binding * 0x100000001);
  range.offset.last = offset + numOffsets + -1;
  range.offset.start = offset;
  lVar5 = 0;
  uVar4 = 0;
  while( true ) {
    pTVar2 = (this->usedAtomics).
             super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->usedAtomics).
                      super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) <= uVar4) {
      std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::push_back
                (&this->usedAtomics,&range);
      return -1;
    }
    bVar3 = TOffsetRange::overlap(&range,(TOffsetRange *)((long)&(pTVar2->binding).start + lVar5));
    if (bVar3) break;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  iVar1 = *(int *)((long)&(((this->usedAtomics).
                            super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>
                            ._M_impl.super__Vector_impl_data._M_start)->offset).start + lVar5);
  if (iVar1 <= offset) {
    return offset;
  }
  return iVar1;
}

Assistant:

int TIntermediate::addUsedOffsets(int binding, int offset, int numOffsets)
{
    TRange bindingRange(binding, binding);
    TRange offsetRange(offset, offset + numOffsets - 1);
    TOffsetRange range(bindingRange, offsetRange);

    // check for collisions, except for vertex inputs on desktop
    for (size_t r = 0; r < usedAtomics.size(); ++r) {
        if (range.overlap(usedAtomics[r])) {
            // there is a collision; pick one
            return std::max(offset, usedAtomics[r].offset.start);
        }
    }

    usedAtomics.push_back(range);

    return -1; // no collision
}